

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadDeletedProperty<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined6 in_register_00000032;
  long lVar2;
  void *local_48;
  iterator iStack_40;
  unsigned_long *local_38;
  unsigned_long local_28;
  
  iVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar1 != '\0') {
    local_48 = (void *)0x0;
    iStack_40._M_current = (unsigned_long *)0x0;
    local_38 = (unsigned_long *)0x0;
    iVar1 = (*this->_vptr_Deserializer[8])(this);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (lVar2 != 0) {
      do {
        iVar1 = (*this->_vptr_Deserializer[0x15])(this);
        local_28 = CONCAT44(extraout_var_00,iVar1);
        if (iStack_40._M_current == local_38) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,iStack_40,
                     &local_28);
        }
        else {
          *iStack_40._M_current = local_28;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48);
    }
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadDeletedProperty(const field_id_t field_id, const char *tag) {
		// Try to read the property. If not present, great!
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return;
		}
		// Otherwise read and discard the value
		(void)Read<T>();
		OnOptionalPropertyEnd(true);
	}